

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

void __thiscall
onmt::Tokenizer::Tokenizer
          (Tokenizer *this,Mode mode,SubwordEncoder *subword_encoder,int flags,string *joiner)

{
  undefined4 in_ECX;
  ITokenizer *in_RDI;
  undefined8 in_R8;
  Options *in_stack_00000070;
  shared_ptr<const_onmt::SubwordEncoder> *in_stack_ffffffffffffff98;
  Tokenizer *this_00;
  string *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  ITokenizer::ITokenizer(in_RDI);
  in_RDI->_vptr_ITokenizer = (_func_int **)&PTR__Tokenizer_006efd98;
  Options::Options((Options *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                   (Mode)((ulong)in_R8 >> 0x20),(int)in_R8,in_stack_ffffffffffffffd0);
  this_00 = (Tokenizer *)(in_RDI + 0x16);
  std::shared_ptr<const_onmt::SubwordEncoder>::shared_ptr
            ((shared_ptr<const_onmt::SubwordEncoder> *)0x3c1f90);
  Options::validate(in_stack_00000070);
  std::shared_ptr<onmt::SubwordEncoder_const>::shared_ptr<onmt::SubwordEncoder_const,void>
            ((shared_ptr<const_onmt::SubwordEncoder> *)this_00,
             (SubwordEncoder *)in_stack_ffffffffffffff98);
  set_subword_encoder(this_00,in_stack_ffffffffffffff98);
  std::shared_ptr<const_onmt::SubwordEncoder>::~shared_ptr
            ((shared_ptr<const_onmt::SubwordEncoder> *)0x3c1fcc);
  return;
}

Assistant:

Tokenizer::Tokenizer(Mode mode,
                       const SubwordEncoder* subword_encoder,
                       int flags,
                       const std::string& joiner)
    : _options(mode, flags, joiner)
  {
    _options.validate();
    set_subword_encoder(std::shared_ptr<const SubwordEncoder>(subword_encoder));
  }